

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signature.h
# Opt level: O2

void __thiscall winmd::reader::RetTypeSig::RetTypeSig(RetTypeSig *this,RetTypeSig *param_1)

{
  std::vector<winmd::reader::CustomModSig,_std::allocator<winmd::reader::CustomModSig>_>::vector
            (&this->m_cmod,&param_1->m_cmod);
  this->m_byref = param_1->m_byref;
  std::_Optional_base<winmd::reader::TypeSig,_false,_false>::_Optional_base
            (&(this->m_type).super__Optional_base<winmd::reader::TypeSig,_false,_false>,
             &(param_1->m_type).super__Optional_base<winmd::reader::TypeSig,_false,_false>);
  return;
}

Assistant:

RetTypeSig(table_base const* table, byte_view& data)
            : m_cmod(parse_cmods(table, data))
            , m_byref(is_by_ref(data))
        {
            auto cursor = data;
            auto element_type = uncompress_enum<ElementType>(cursor);
            if (element_type == ElementType::Void)
            {
                data = cursor;
            }
            else
            {
                m_type.emplace(table, data);
            }
        }